

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

void __thiscall
banksia::ChessBoard::gen_addMove
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          int from,int dest,bool captureOnly)

{
  Piece PVar1;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *in_RSI;
  MoveFull *in_RDI;
  byte in_R8B;
  Side fromSide;
  Piece movingPiece;
  Side toSide;
  undefined4 in_stack_ffffffffffffff98;
  PieceType in_stack_ffffffffffffff9c;
  undefined4 uStack_2c;
  undefined4 uStack_24;
  
  PVar1 = BoardCore::getPiece((BoardCore *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  uStack_24 = PVar1.side;
  PVar1 = BoardCore::getPiece((BoardCore *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  uStack_2c = PVar1.side;
  if ((uStack_2c != uStack_24) && (((in_R8B & 1) == 0 || (uStack_24 != none)))) {
    MoveFull::MoveFull(in_RDI,PVar1,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                       in_stack_ffffffffffffff9c);
    std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::push_back
              (in_RSI,(value_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  return;
}

Assistant:

void ChessBoard::gen_addMove(std::vector<MoveFull>& moveList, int from, int dest, bool captureOnly) const
{
    auto toSide = getPiece(dest).side;
    auto movingPiece = getPiece(from);
    auto fromSide = movingPiece.side;
    
    if (fromSide != toSide && (!captureOnly || toSide != Side::none)) {
        moveList.push_back(MoveFull(movingPiece, from, dest));
    }
}